

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O0

void __thiscall npas4_AllocSystem_Test::TestBody(npas4_AllocSystem_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  long lVar4;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_11;
  int64_t memoryDelta;
  AssertHelper local_248;
  Message local_240;
  long local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_10;
  Message local_218;
  long local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_9;
  Message local_1e8;
  long local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_8;
  Message local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_7;
  uint8_t *megabyte;
  int64_t allocAmmount;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_188;
  AssertHelper local_180;
  Message local_178;
  long local_170;
  long local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_6;
  Message local_148;
  long local_140;
  long local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_5;
  Message local_118;
  long local_110;
  long local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  int64_t startUsedByCurrentProcess;
  Message local_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  long local_38;
  long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  int64_t startTotal;
  npas4_AllocSystem_Test *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       npas4::GetRAMSystemTotal();
  local_30 = npas4::GetRAMSystemTotal();
  local_38 = 0x400;
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_28,"npas4::GetRAMSystemTotal()","int64_t(1024)",&local_30,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_70 = npas4::GetRAMSystemTotal();
  local_78 = npas4::GetRAMSystemAvailable();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_68,"npas4::GetRAMSystemTotal()","npas4::GetRAMSystemAvailable()",
             &local_70,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a0 = npas4::GetRAMSystemTotal();
  local_a8 = npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_98,"npas4::GetRAMSystemTotal()","npas4::GetRAMSystemUsed()",&local_a0
             ,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_d0 = npas4::GetRAMSystemAvailable();
  local_d8 = npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_c8,"npas4::GetRAMSystemAvailable()","npas4::GetRAMSystemUsed()",
             &local_d0,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&startUsedByCurrentProcess,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&startUsedByCurrentProcess,&local_e0)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&startUsedByCurrentProcess);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gtest_ar_4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       npas4::GetRAMSystemUsedByCurrentProcess();
  local_108 = npas4::GetRAMSystemTotal();
  local_110 = npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"npas4::GetRAMSystemTotal()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",&local_108,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_138 = npas4::GetRAMSystemAvailable();
  local_140 = npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_130,"npas4::GetRAMSystemAvailable()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",&local_138,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_168 = npas4::GetRAMSystemUsed();
  local_170 = npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_160,"npas4::GetRAMSystemUsed()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",&local_168,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_188.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&allocAmmount);
  bVar1 = std::chrono::operator==
                    (&local_188,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&allocAmmount);
  if (bVar1) {
    megabyte = (uint8_t *)(DWORD_ARRAY_00100b88 + 0x11e);
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new__(0x101000);
    local_1b8 = npas4::GetRAMSystemTotal();
    testing::internal::EqHelper<false>::Compare<long,long>
              ((EqHelper<false> *)local_1b0,"startTotal","npas4::GetRAMSystemTotal()",
               (long *)&gtest_ar.message_,&local_1b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x49,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    local_1e0 = npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperNE<long,long>
              ((internal *)local_1d8,"startUsedByCurrentProcess",
               "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&gtest_ar_4.message_,&local_1e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pMVar3 = testing::Message::operator<<
                         (&local_1e8,
                          (char (*) [68])
                          "We did an allocation, but are using exactly the same amount of RAM.");
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x4a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    local_208 = gtest_ar_4.message_.ptr_ + 0x8080;
    local_210 = npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperLT<long,long>
              ((internal *)local_200,"startUsedByCurrentProcess + allocAmmount",
               "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&local_208,&local_210);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
    if (!bVar1) {
      testing::Message::Message(&local_218);
      pMVar3 = testing::Message::operator<<
                         (&local_218,
                          (char (*) [54])"We did an allocation, but are using less RAM. Start: ");
      pMVar3 = testing::Message::operator<<(pMVar3,(long *)&gtest_ar_4.message_);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [10])", Alloc: ");
      pMVar3 = testing::Message::operator<<(pMVar3,(long *)&megabyte);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x4c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_218);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
    local_238 = npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperGT<long,long>
              ((internal *)local_230,"npas4::GetRAMSystemUsedByCurrentProcess()",
               "startUsedByCurrentProcess",&local_238,(long *)&gtest_ar_4.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message(&local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    if (bVar1) {
      lVar4 = npas4::GetRAMSystemUsedByCurrentProcess();
      gtest_ar_11.message_.ptr_ = lVar4 - gtest_ar_4.message_.ptr_;
      lVar4 = npas4::GetRAMSystemUsedByCurrentProcess();
      testing::internal::DoubleNearPredFormat
                ((internal *)local_268,
                 "npas4::GetRAMSystemUsedByCurrentProcess() - startUsedByCurrentProcess",
                 "memoryDelta","4096",(double)(lVar4 - (long)gtest_ar_4.message_.ptr_),
                 (double)(long)gtest_ar_11.message_.ptr_,4096.0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_270);
        pMVar3 = testing::Message::operator<<(&local_270,(char (*) [15])"Memory Delta: ");
        pMVar3 = testing::Message::operator<<(pMVar3,(long *)&gtest_ar_11.message_);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  (&local_278,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                   ,0x53,pcVar2);
        testing::internal::AssertHelper::operator=(&local_278,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_278);
        testing::Message::~Message(&local_270);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      if (gtest_ar_7.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(gtest_ar_7.message_.ptr_);
      }
    }
  }
  return;
}

Assistant:

TEST(npas4, AllocSystem)
{
	const auto startTotal = npas4::GetRAMSystemTotal();
	EXPECT_GT(npas4::GetRAMSystemTotal(), int64_t(1024));
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemAvailable());
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsed());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsed());

	const auto startUsedByCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess();
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemUsed(), npas4::GetRAMSystemUsedByCurrentProcess());

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		EXPECT_EQ(startTotal, npas4::GetRAMSystemTotal());
		EXPECT_NE(startUsedByCurrentProcess, npas4::GetRAMSystemUsedByCurrentProcess()) << "We did an allocation, but are using exactly the same amount of RAM.";

		EXPECT_LT(startUsedByCurrentProcess + allocAmmount, npas4::GetRAMSystemUsedByCurrentProcess())
			<< "We did an allocation, but are using less RAM. Start: " << startUsedByCurrentProcess << ", Alloc: " << allocAmmount;

		// Assume we are not swapping out to disk
		ASSERT_GT(npas4::GetRAMSystemUsedByCurrentProcess(), startUsedByCurrentProcess);

		const auto memoryDelta = npas4::GetRAMSystemUsedByCurrentProcess() - startUsedByCurrentProcess;
		EXPECT_NEAR(npas4::GetRAMSystemUsedByCurrentProcess() - startUsedByCurrentProcess, memoryDelta, 4096) << "Memory Delta: " << memoryDelta;

		delete[] megabyte;
	}
}